

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O3

void Wln_RetFindSources_rec(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iObj_00;
  int *piVar4;
  Wln_Ntk_t *pWVar5;
  Wln_Vec_t *pWVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  if (-1 < iObj) {
    pWVar5 = p->pNtk;
    if (iObj < (pWVar5->vTypes).nSize) {
      if ((pWVar5->vTypes).pArray[(uint)iObj] != 3) {
        if ((pWVar5->vTravIds).nSize <= iObj) goto LAB_0038b6e8;
        piVar4 = (pWVar5->vTravIds).pArray;
        if (piVar4[(uint)iObj] != pWVar5->nTravIds) {
          piVar4[(uint)iObj] = pWVar5->nTravIds;
          if (((p->vPathDelays).nSize <= iObj) || ((p->vNodeDelays).nSize <= iObj))
          goto LAB_0038b6e8;
          iVar1 = (p->vPathDelays).pArray[(uint)iObj];
          iVar2 = (p->vNodeDelays).pArray[(uint)iObj];
          pWVar6 = pWVar5->vFanins;
          if (0 < pWVar6[(uint)iObj].nSize) {
            lVar9 = 0;
            do {
              uVar3 = (p->vFanins).nSize;
              if ((int)uVar3 <= iObj) goto LAB_0038b6e8;
              piVar4 = (p->vFanins).pArray;
              lVar8 = (long)piVar4[(uint)iObj];
              if ((lVar8 < 0) || (uVar3 <= (uint)piVar4[(uint)iObj])) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
              }
              iObj_00 = piVar4[lVar8 + lVar9 * 2];
              lVar7 = (long)iObj_00;
              if (lVar7 != 0) {
                if (pWVar6[lVar7].nSize == 0) {
                  if ((iObj_00 < 0) || ((pWVar5->vTypes).nSize <= iObj_00)) goto LAB_0038b6e8;
                  if ((pWVar5->vTypes).pArray[lVar7] != 3) goto LAB_0038b69f;
                }
                if (piVar4[lVar8 + lVar9 * 2 + 1] == 0) {
                  if ((iObj_00 < 0) || ((p->vPathDelays).nSize <= iObj_00)) goto LAB_0038b6e8;
                  if ((p->vPathDelays).pArray[lVar7] == iVar1 - iVar2) {
                    Wln_RetFindSources_rec(p,iObj_00);
                    pWVar5 = p->pNtk;
                  }
                }
              }
LAB_0038b69f:
              lVar9 = lVar9 + 1;
              pWVar6 = pWVar5->vFanins;
            } while (lVar9 < pWVar6[(uint)iObj].nSize);
          }
          if (iVar1 == iVar2) {
            Vec_IntPush(&p->vSources,iObj);
            return;
          }
        }
      }
      return;
    }
  }
LAB_0038b6e8:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Wln_RetFindSources_rec( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, * pLink, FaninDelay;
    if ( Wln_ObjIsCi(p->pNtk, iObj) || Wln_ObjCheckTravId(p->pNtk, iObj) )
        return;
    FaninDelay = Vec_IntEntry( &p->vPathDelays, iObj ) - Vec_IntEntry( &p->vNodeDelays, iObj );
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
        if ( !pLink[0] && Vec_IntEntry(&p->vPathDelays, iFanin) == FaninDelay )
            Wln_RetFindSources_rec( p, iFanin );
    if ( FaninDelay == 0 )
        Vec_IntPush( &p->vSources, iObj );
}